

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void statement(LexState *ls)

{
  unsigned_short *puVar1;
  byte bVar2;
  byte bVar3;
  FuncState *pFVar4;
  LocVar *pLVar5;
  LexState *ls_00;
  expkind list;
  int iVar6;
  int iVar7;
  int iVar8;
  ravi_type_map rVar9;
  uint uVar10;
  int iVar11;
  TString *pTVar12;
  TString *pTVar13;
  long lVar14;
  ushort uVar15;
  Labeldesc *pLVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  char *pcVar20;
  FuncState *pFVar21;
  expdesc *info;
  TString **pusertype;
  Labellist *l;
  expdesc e;
  Fornuminfo tlimit;
  Fornuminfo tidx;
  BlockCnt bl2;
  expdesc local_728;
  long local_6f0;
  Fornuminfo local_6e8 [6];
  undefined1 local_698 [8];
  undefined1 auStack_690 [24];
  ravi_type_map rStack_678;
  ravi_type_map rStack_674;
  ravi_type_map rStack_670;
  undefined4 uStack_66c;
  int iStack_668;
  undefined4 uStack_664;
  undefined1 local_258 [24];
  undefined8 uStack_240;
  ravi_type_map rStack_238;
  undefined1 auStack_234 [12];
  int iStack_228;
  undefined4 uStack_224;
  
  iVar8 = ls->linenumber;
  uVar15 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar15;
  if (0x7d < uVar15) {
    errorlimit(ls->fs,0x7d,"C levels");
  }
  iVar7 = (ls->t).token;
  switch(iVar7) {
  case 0x102:
  case 0x10a:
    iVar8 = luaK_jump(ls->fs);
    gotostat(ls,iVar8);
    break;
  case 0x103:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x106,0x103,iVar8);
    break;
  case 0x108:
    pFVar21 = ls->fs;
    iVar6 = 1;
    enterblock(pFVar21,(BlockCnt *)local_258,'\x01');
    luaX_next(ls);
    pTVar13 = str_checkname(ls);
    iVar7 = (ls->t).token;
    if ((iVar7 == 0x2c) || (iVar7 == 0x10c)) {
      pFVar4 = ls->fs;
      rStack_674 = 0;
      rStack_670 = 0;
      uStack_66c = 0;
      uStack_664 = 0;
      local_698._0_4_ = VVOID;
      local_698._4_4_ = 0;
      auStack_690._0_4_ = VVOID;
      auStack_690._4_4_ = 0;
      auStack_690._8_4_ = 0;
      auStack_690._12_4_ = 0;
      auStack_690._16_8_ = (TString *)0x0;
      rStack_678 = 0xffffffff;
      iStack_668 = -1;
      bVar2 = pFVar4->freereg;
      pTVar12 = luaX_newstring(ls,"(for generator)",0xf);
      new_localvar(ls,pTVar12,0xffffffff,(TString *)0x0);
      pTVar12 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar12,0xffffffff,(TString *)0x0);
      pTVar12 = luaX_newstring(ls,"(for control)",0xd);
      new_localvar(ls,pTVar12,0xffffffff,(TString *)0x0);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      if ((ls->t).token == 0x2c) {
        iVar6 = 1;
        do {
          luaX_next(ls);
          pTVar13 = str_checkname(ls);
          new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
          iVar6 = iVar6 + 1;
        } while ((ls->t).token == 0x2c);
      }
      checknext(ls,0x10c);
      iVar7 = ls->linenumber;
      iVar18 = explist(ls,(expdesc *)local_698);
      adjust_assign(ls,3,iVar18,(expdesc *)local_698);
      luaK_checkstack(pFVar4,3);
      iVar18 = 0;
      info = (expdesc *)0x0;
    }
    else {
      if (iVar7 != 0x3d) {
        pcVar20 = "\'=\' or \'in\' expected";
        goto LAB_0012095f;
      }
      pFVar4 = ls->fs;
      bVar2 = pFVar4->freereg;
      pTVar12 = luaX_newstring(ls,"(for index)",0xb);
      new_localvar(ls,pTVar12,0xffffffff,(TString *)0x0);
      pTVar12 = luaX_newstring(ls,"(for limit)",0xb);
      new_localvar(ls,pTVar12,0xffffffff,(TString *)0x0);
      pTVar12 = luaX_newstring(ls,"(for step)",10);
      new_localvar(ls,pTVar12,0xffffffff,(TString *)0x0);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      lVar14 = (long)pFVar4->nlocvars;
      checknext(ls,0x3d);
      auStack_690._0_4_ = VVOID;
      local_698._0_4_ = ~VVOID;
      local_698._4_4_ = 0;
      local_6e8[0].int_value = 0;
      local_6e8[0].type_map = 0xffffffff;
      local_6e8[0].is_constant = 0;
      local_728.u.info = 0;
      local_728.k = VLOCAL;
      local_728._4_4_ = 0;
      exp1(ls,(Fornuminfo *)local_698);
      checknext(ls,0x2c);
      exp1(ls,local_6e8);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        exp1(ls,(Fornuminfo *)&local_728);
      }
      else {
        local_728._4_4_ = 1;
        local_728.u.info = 1;
        bVar3 = pFVar4->freereg;
        iVar7 = luaK_intK(pFVar4,1);
        luaK_codek(pFVar4,(uint)bVar3,iVar7);
        luaK_reserveregs(pFVar4,1);
      }
      info = (expdesc *)0x0;
      if ((local_698._0_4_ == local_6e8[0].type_map) && (local_6e8[0].type_map == local_728.k)) {
        if ((local_698._0_4_ == 0x10) || (local_698._0_4_ == VLOCAL)) {
          info = &local_728;
          if (local_728._4_4_ == 0) {
            info = (expdesc *)0x0;
          }
          if (local_698._0_4_ != VLOCAL) {
            info = (expdesc *)0x0;
          }
          pLVar5 = pFVar4->f->locvars;
          pLVar5[lVar14 + -1].ravi_type_map = local_698._0_4_;
          pLVar5[lVar14 + -2].ravi_type_map = local_698._0_4_;
          pLVar5[lVar14 + -3].ravi_type_map = local_698._0_4_;
          pLVar5[lVar14 + -4].ravi_type_map = local_698._0_4_;
          if (((byte)ravi_parser_debug & 4) != 0) {
            raviY_printf(pFVar4,"fornum -> setting type for index %v\n",pLVar5 + lVar14 + -4);
          }
          if (((byte)ravi_parser_debug & 4) != 0) {
            raviY_printf(pFVar4,"fornum -> setting type for limit %v\n",pLVar5 + lVar14 + -3);
          }
          if (((byte)ravi_parser_debug & 4) != 0) {
            raviY_printf(pFVar4,"fornum -> setting type for step %v\n",pLVar5 + lVar14 + -2);
          }
          if (((byte)ravi_parser_debug & 4) != 0) {
            raviY_printf(pFVar4,"fornum -> setting type for variable %v\n",pLVar5 + lVar14 + -1);
          }
        }
        else {
          info = (expdesc *)0x0;
        }
      }
      iVar6 = 1;
      iVar18 = 1;
      iVar7 = iVar8;
    }
    forbody(ls,(uint)bVar2,iVar7,iVar6,iVar18,(Fornuminfo *)info);
    check_match(ls,0x106,0x108,iVar8);
    goto LAB_00120d42;
  case 0x109:
    auStack_690._4_4_ = 0;
    rStack_670 = 0;
    uStack_66c = 0;
    uStack_664 = 0;
    local_698._0_4_ = VVOID;
    local_698._4_4_ = 0;
    auStack_690._0_4_ = VVOID;
    auStack_690._8_4_ = 0;
    auStack_690._12_4_ = 0;
    auStack_690._16_8_ = (TString *)0x0;
    rStack_678 = 0xffffffff;
    iStack_668 = -1;
    auStack_234 = ZEXT412(0);
    uStack_224 = 0;
    local_258._4_12_ = SUB1612(ZEXT816(0) << 0x40,4);
    local_258[0x10] = 0;
    local_258[0x11] = '\0';
    local_258[0x12] = '\0';
    local_258[0x13] = '\0';
    local_258._20_4_ = 0;
    uStack_240._0_4_ = 0;
    uStack_240._4_4_ = 0;
    rStack_238 = 0xffffffff;
    iStack_228 = -1;
    rStack_674 = auStack_690._4_4_;
    local_258._0_4_ = local_698._0_4_;
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_698);
    while (iVar7 = (ls->t).token, iVar7 == 0x2e) {
      fieldsel(ls,(expdesc *)local_698);
    }
    if (iVar7 == 0x3a) {
      fieldsel(ls,(expdesc *)local_698);
    }
    if (((byte)ravi_parser_debug & 4) != 0) {
      raviY_printf(ls->fs,"funcstat -> declaring function %e\n",local_698);
    }
    body(ls,(expdesc *)local_258,(uint)(iVar7 == 0x3a),iVar8,0);
    luaK_storevar(ls->fs,(expdesc *)local_698,(expdesc *)local_258);
    luaK_fixline(ls->fs,iVar8);
    break;
  case 0x10b:
    pFVar21 = ls->fs;
    local_698._0_4_ = ~VVOID;
    do {
      test_then_block(ls,(int *)local_698);
      iVar7 = (ls->t).token;
    } while (iVar7 == 0x105);
    if (iVar7 == 0x104) {
      luaX_next(ls);
      block(ls);
    }
    check_match(ls,0x106,0x10b,iVar8);
    list = local_698._0_4_;
    goto LAB_0012055e;
  case 0x10d:
    luaX_next(ls);
    if ((ls->t).token != 0x109) {
      local_728.usertype = (TString *)0x0;
      local_728.k = VVOID;
      local_728._4_4_ = 0;
      local_728.u.info = 0;
      local_728.u.ind.key_ravi_type_map = 0;
      local_728.u.ind.usertype = (TString *)0x0;
      local_728.t = 0;
      local_728.f = 0;
      local_728.ravi_type_map = 0xffffffff;
      local_728._36_4_ = 0;
      local_728.pc = -1;
      local_728._52_4_ = 0;
      lVar14 = 0;
      memset(local_258,0,0x21c);
      memset(local_698,0,0x438);
      local_258._0_4_ = declare_localvar(ls,(TString **)local_698);
      pusertype = (TString **)auStack_690;
      do {
        if ((ls->t).token != 0x2c) {
          lVar19 = lVar14 + 1;
          if ((ls->t).token == 0x3d) {
            luaX_next(ls);
            iVar8 = localvar_explist(ls,&local_728,(ravi_type_map *)local_258,(TString **)local_698,
                                     (int)lVar19);
          }
          else {
            local_728.k = VVOID;
            iVar8 = 0;
          }
          pFVar21 = ls->fs;
          iVar7 = (1 - iVar8) + (int)lVar14;
          if (local_728.k - VCALL < 2) {
            iVar6 = -1;
            if (-1 < iVar7) {
              iVar6 = iVar7;
            }
            local_6f0 = lVar19;
            luaK_setreturns(pFVar21,&local_728,iVar6 + 1);
            if ((-1 < iVar7) && (local_728.k == VCALL)) {
              uVar17 = ls->fs->f->code[local_728.u.info];
              if ((char)uVar17 != '$') {
                __assert_fail("((OpCode)(((*pc)&0xff))) == OP_CALL",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                              ,0x2a8,"void ravi_coercetype(LexState *, expdesc *, int)");
              }
              if (0 < iVar7) {
                uVar17 = uVar17 >> 8 & 0x7f;
                iVar18 = uVar17 + 1;
                do {
                  iVar11 = register_to_locvar_index(ls->fs,iVar18);
                  pLVar5 = ls->fs->f->locvars;
                  ravi_code_typecoersion
                            (ls,iVar18,pLVar5[iVar11].ravi_type_map,pLVar5[iVar11].usertype);
                  iVar18 = iVar18 + 1;
                } while (iVar18 < (int)(iVar6 + 1 + uVar17));
              }
            }
            lVar19 = local_6f0;
            if (0 < iVar7) {
              luaK_reserveregs(pFVar21,iVar6);
            }
          }
          else {
            if (local_728.k != VVOID) {
              luaK_exp2nextreg(pFVar21,&local_728);
            }
            if (0 < iVar7) {
              bVar2 = pFVar21->freereg;
              uVar17 = (uint)bVar2;
              luaK_reserveregs(pFVar21,iVar7);
              luaK_nil(pFVar21,uVar17,iVar7);
              do {
                iVar7 = register_to_locvar_index(pFVar21,uVar17);
                uVar10 = pFVar21->f->locvars[iVar7].ravi_type_map;
                if ((uVar10 == 0x10) || (uVar10 == 8)) {
                  luaK_codeABC(pFVar21,(uVar10 == 0x10) + OP_RAVI_LOADIZ,uVar17,0,0);
                }
                else if ((uVar10 & 1) == 0) {
                  raviY_typemap_string(uVar10,(char *)local_6e8);
                  ls_00 = pFVar21->ls;
                  pcVar20 = luaO_pushfstring(ls_00->L,"uninitialized %s in local variable",local_6e8
                                            );
                  luaX_syntaxerror(ls_00,pcVar20);
                }
                uVar17 = uVar17 + 1;
              } while ((int)uVar17 < (int)(((uint)bVar2 - iVar8) + 1 + (int)lVar14));
            }
          }
          if ((int)lVar19 < iVar8) {
            ls->fs->freereg = (char)lVar14 + (ls->fs->freereg - (char)iVar8) + '\x01';
          }
          adjustlocalvars(ls,(int)lVar19);
          goto LAB_00120d47;
        }
        luaX_next(ls);
        rVar9 = declare_localvar(ls,pusertype);
        *(ravi_type_map *)(local_258 + lVar14 * 4 + 4) = rVar9;
        lVar14 = lVar14 + 1;
        pusertype = pusertype + 1;
      } while (lVar14 != 0x86);
      pcVar20 = "too many local variables";
      goto LAB_0012095f;
    }
    luaX_next(ls);
    iVar8 = 0;
    goto LAB_00120628;
  case 0x10e:
    luaX_next(ls);
    iVar8 = 1;
LAB_00120628:
    localfunc(ls,iVar8);
    break;
  case 0x112:
    pFVar21 = ls->fs;
    iVar7 = luaK_getlabel(pFVar21);
    enterblock(pFVar21,(BlockCnt *)local_698,'\x01');
    enterblock(pFVar21,(BlockCnt *)local_258,'\0');
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x116,0x112,iVar8);
    iVar8 = cond(ls);
    if (local_258[0x11] != '\0') {
      luaK_patchclose(pFVar21,iVar8,(uint)(byte)local_258[0x10]);
    }
    leaveblock(pFVar21);
    luaK_patchlist(pFVar21,iVar8,iVar7);
LAB_00120d42:
    leaveblock(pFVar21);
    break;
  case 0x113:
    luaX_next(ls);
    pFVar21 = ls->fs;
    rStack_674 = 0;
    rStack_670 = 0;
    uStack_66c = 0;
    uStack_664 = 0;
    local_698._0_4_ = VVOID;
    local_698._4_4_ = 0;
    auStack_690._0_4_ = VVOID;
    auStack_690._4_4_ = 0;
    auStack_690._8_4_ = 0;
    auStack_690._12_4_ = 0;
    auStack_690._16_8_ = (TString *)0x0;
    rStack_678 = 0xffffffff;
    iStack_668 = -1;
    iVar8 = (ls->t).token;
    uVar17 = iVar8 - 0x104;
    uVar10 = 0;
    if (iVar8 == 0x3b) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      uVar10 = 0;
      if ((uVar17 < 0x1f & (byte)(0x40040007 >> (uVar17 & 0x1f))) == 0) {
        iVar8 = explist(ls,(expdesc *)local_698);
        if (local_698._0_4_ - VCALL < 2) {
          luaK_setreturns(pFVar21,(expdesc *)local_698,-1);
          if (((iVar8 == 1 && local_698._0_4_ == VCALL) && (pFVar21->bl->insidetbc == '\0')) &&
             (*(undefined1 *)(pFVar21->f->code + (int)auStack_690._0_4_) = 0x25,
             (pFVar21->f->code[(int)auStack_690._0_4_] >> 8 & 0x7f) != (uint)pFVar21->nactvar)) {
            __assert_fail("((int)(((((fs)->f->code[(&e)->u.info]))>>8)&0x7f)) == fs->nactvar",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                          ,0x959,"void retstat(LexState *)");
          }
          uVar10 = (uint)pFVar21->nactvar;
          iVar8 = -1;
        }
        else if (iVar8 == 1) {
          uVar10 = luaK_exp2anyreg(pFVar21,(expdesc *)local_698);
          iVar8 = 1;
        }
        else {
          luaK_exp2nextreg(pFVar21,(expdesc *)local_698);
          uVar10 = (uint)pFVar21->nactvar;
          if (iVar8 != pFVar21->freereg - uVar10) {
            __assert_fail("nret == fs->freereg - first",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                          ,0x964,"void retstat(LexState *)");
          }
        }
      }
    }
    luaK_ret(pFVar21,uVar10,iVar8);
    if ((ls->t).token != 0x3b) break;
LAB_00120d01:
    luaX_next(ls);
    break;
  case 0x117:
    pFVar21 = ls->fs;
    luaX_next(ls);
    iVar7 = luaK_getlabel(pFVar21);
    list = cond(ls);
    enterblock(pFVar21,(BlockCnt *)local_698,'\x01');
    checknext(ls,0x103);
    block(ls);
    iVar6 = luaK_jump(pFVar21);
    luaK_patchlist(pFVar21,iVar6,iVar7);
    check_match(ls,0x106,0x117,iVar8);
    leaveblock(pFVar21);
LAB_0012055e:
    luaK_patchtohere(pFVar21,list);
    break;
  default:
    if (iVar7 == 0x121) {
      luaX_next(ls);
      pTVar13 = str_checkname(ls);
      pFVar21 = ls->fs;
      iVar7 = pFVar21->bl->firstlabel;
      iVar6 = (ls->dyd->label).n;
      l = &ls->dyd->label;
      if (iVar7 < iVar6) {
        lVar14 = (long)iVar6 - (long)iVar7;
        pLVar16 = l->arr + iVar7;
        do {
          if (pLVar16->name == pTVar13) {
            pcVar20 = luaO_pushfstring(pFVar21->ls->L,"label \'%s\' already defined on line %d",
                                       pTVar13 + 1,(ulong)(uint)pLVar16->line);
            semerror(pFVar21->ls,pcVar20);
          }
          pLVar16 = pLVar16 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      checknext(ls,0x121);
      iVar7 = luaK_getlabel(pFVar21);
      iVar8 = newlabelentry(ls,l,pTVar13,iVar8,iVar7);
      do {
        iVar7 = (ls->t).token;
        if (iVar7 < 0x121) {
          if (iVar7 != 0x3b) goto LAB_00120821;
        }
        else if (iVar7 != 0x121) {
          if (iVar7 != 0x122) goto LAB_00120840;
          goto LAB_0012082b;
        }
        statement(ls);
      } while( true );
    }
    if (iVar7 == 0x3b) goto LAB_00120d01;
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x10c:
  case 0x10f:
  case 0x110:
  case 0x111:
  case 0x114:
  case 0x115:
  case 0x116:
    pFVar21 = ls->fs;
    rStack_670 = 0xffffffff;
    suffixedexp(ls,(expdesc *)auStack_690);
    iVar8 = (ls->t).token;
    if ((iVar8 == 0x3d) || (iVar8 == 0x2c)) {
      local_698._0_4_ = VVOID;
      local_698._4_4_ = 0;
      assignment(ls,(LHS_assign *)local_698,1);
    }
    else {
      if (auStack_690._0_4_ != VCALL) {
        pcVar20 = "syntax error";
LAB_0012095f:
        luaX_syntaxerror(ls,pcVar20);
      }
      *(undefined1 *)((long)pFVar21->f->code + (long)(int)auStack_690._8_4_ * 4 + 2) = 1;
    }
  }
LAB_00120d47:
  pFVar21 = ls->fs;
  if ((pFVar21->freereg <= pFVar21->f->maxstacksize) && (pFVar21->nactvar <= pFVar21->freereg)) {
    pFVar21->freereg = pFVar21->nactvar;
    puVar1 = &ls->L->nCcalls;
    *puVar1 = *puVar1 - 1;
    return;
  }
  __assert_fail("ls->fs->f->maxstacksize >= ls->fs->freereg && ls->fs->freereg >= ls->fs->nactvar",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x9b7,"void statement(LexState *)");
LAB_00120821:
  if (iVar7 - 0x104U < 3) {
LAB_0012082b:
    l->arr[iVar8].nactvar = pFVar21->bl->nactvar;
  }
LAB_00120840:
  findgotos(ls,l->arr + iVar8);
  goto LAB_00120d47;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
#ifdef RAVI_DEFER_STATEMENT
        localfunc(ls, 0);
#else
        localfunc(ls);
#endif
      else
        localstat(ls);
      break;
    }
#ifdef RAVI_DEFER_STATEMENT
    case TK_DEFER: {  /* stat -> deferstat */
      luaX_next(ls);  /* skip DEFER */
      localfunc(ls, 1);
      break;
    }
#endif
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK:   /* stat -> breakstat */
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      gotostat(ls, luaK_jump(ls->fs));
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= ls->fs->nactvar);
  ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  leavelevel(ls);
}